

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

void InitializeInverseRealFFT(int fft_size,InverseRealFFT *inverse_real_fft)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  double *pdVar4;
  fft_complex *padVar5;
  fft_plan local_60;
  InverseRealFFT *local_18;
  InverseRealFFT *inverse_real_fft_local;
  int fft_size_local;
  
  inverse_real_fft->fft_size = fft_size;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)fft_size;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  local_18 = inverse_real_fft;
  inverse_real_fft_local._4_4_ = fft_size;
  pdVar4 = (double *)operator_new__(uVar3);
  local_18->waveform = pdVar4;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)inverse_real_fft_local._4_4_;
  uVar3 = SUB168(auVar2 * ZEXT816(0x10),0);
  if (SUB168(auVar2 * ZEXT816(0x10),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  padVar5 = (fft_complex *)operator_new__(uVar3);
  local_18->spectrum = padVar5;
  fft_plan_dft_c2r_1d(&local_60,inverse_real_fft_local._4_4_,local_18->spectrum,local_18->waveform,3
                     );
  memcpy(&local_18->inverse_fft,&local_60,0x48);
  return;
}

Assistant:

void InitializeInverseRealFFT(int fft_size, InverseRealFFT *inverse_real_fft) {
  inverse_real_fft->fft_size = fft_size;
  inverse_real_fft->waveform = new double[fft_size];
  inverse_real_fft->spectrum = new fft_complex[fft_size];
  inverse_real_fft->inverse_fft = fft_plan_dft_c2r_1d(fft_size,
      inverse_real_fft->spectrum, inverse_real_fft->waveform, FFT_ESTIMATE);
}